

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_30::SocketAddress::bind
          (SocketAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  void *pvVar2;
  String local_78;
  Fault local_60;
  Fault f_1;
  SyscallResult local_48 [2];
  SyscallResult _kjSyscallResult_1;
  Fault local_38;
  Fault f;
  SyscallResult local_1c;
  undefined4 local_18;
  SyscallResult _kjSyscallResult;
  int value;
  int sockfd_local;
  SocketAddress *this_local;
  
  _kjSyscallResult.errorNumber = __fd;
  if ((this->wildcard & 1U) != 0) {
    local_18 = 0;
    f.exception = (Exception *)&_kjSyscallResult;
    local_1c = _::Debug::
               syscall<kj::(anonymous_namespace)::SocketAddress::bind(int)const::_lambda()_1_>
                         ((anon_class_16_2_59ce61ba *)&f,false);
    pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_1c);
    if (pvVar2 == (void *)0x0) {
      iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_1c);
      _::Debug::Fault::Fault
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x22d,iVar1,"setsockopt(sockfd, IPPROTO_IPV6, IPV6_V6ONLY, &value, sizeof(value))"
                 ,"");
      _::Debug::Fault::fatal(&local_38);
    }
  }
  f_1.exception = (Exception *)&_kjSyscallResult;
  local_48[0] = _::Debug::
                syscall<kj::(anonymous_namespace)::SocketAddress::bind(int)const::_lambda()_2_>
                          ((anon_class_16_2_a10ec7b5 *)&f_1,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(local_48);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(local_48);
    toString(&local_78,this);
    _::Debug::Fault::Fault<int,kj::String>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x231,iVar1,"::bind(sockfd, &addr.generic, addrlen)","toString()",&local_78);
    String::~String(&local_78);
    _::Debug::Fault::fatal(&local_60);
  }
  return (int)pvVar2;
}

Assistant:

void bind(int sockfd) const {
#if !defined(__OpenBSD__)
    if (wildcard) {
      // Disable IPV6_V6ONLY because we want to handle both ipv4 and ipv6 on this socket.  (The
      // default value of this option varies across platforms.)
      int value = 0;
      KJ_SYSCALL(setsockopt(sockfd, IPPROTO_IPV6, IPV6_V6ONLY, &value, sizeof(value)));
    }
#endif

    KJ_SYSCALL(::bind(sockfd, &addr.generic, addrlen), toString());
  }